

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O2

Reference __thiscall
mp::BasicExprFactory<std::allocator<char>_>::MakeReference
          (BasicExprFactory<std::allocator<char>_> *this,Kind kind,int index)

{
  Impl *impl;
  Reference RVar1;
  
  impl = Allocate<mp::Reference>(this,kind,0);
  impl->index = index;
  RVar1 = internal::ExprBase::Create<mp::Reference>(&impl->super_Impl);
  return (Reference)RVar1.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_
  ;
}

Assistant:

Reference MakeReference(expr::Kind kind, int index) {
    typename Reference::Impl *impl = Allocate<Reference>(kind);
    impl->index = index;
    return Expr::Create<Reference>(impl);
  }